

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_binary.c
# Opt level: O1

int archive_write_binary_header(archive_write *a,archive_entry *entry)

{
  mode_t mVar1;
  wchar_t wVar2;
  int iVar3;
  char *pcVar4;
  archive_string_conv *sc;
  int *piVar5;
  la_int64_t lVar6;
  size_t len;
  char *path;
  size_t local_20;
  char *local_18;
  
  mVar1 = archive_entry_filetype(entry);
  if ((mVar1 == 0) && (pcVar4 = archive_entry_hardlink(entry), pcVar4 == (char *)0x0)) {
    pcVar4 = "Filetype required";
  }
  else {
    sc = get_sconv(a);
    wVar2 = _archive_entry_pathname_l(entry,&local_18,&local_20,sc);
    if ((wVar2 != L'\0') && (piVar5 = __errno_location(), *piVar5 == 0xc)) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
      return -0x1e;
    }
    if ((local_18 == (char *)0x0 || local_20 == 0) || (*local_18 == '\0')) {
      pcVar4 = "Pathname required";
    }
    else {
      wVar2 = archive_entry_size_is_set(entry);
      if ((wVar2 != L'\0') && (lVar6 = archive_entry_size(entry), -1 < lVar6)) {
        iVar3 = write_header(a,entry);
        return iVar3;
      }
      pcVar4 = "Size required";
    }
  }
  archive_set_error(&a->archive,-1,pcVar4);
  return -0x19;
}

Assistant:

static int
archive_write_binary_header(struct archive_write *a, struct archive_entry *entry)
{
	const char *path;
	size_t len;

	if (archive_entry_filetype(entry) == 0 && archive_entry_hardlink(entry) == NULL) {
		archive_set_error(&a->archive, -1, "Filetype required");
		return (ARCHIVE_FAILED);
	}

	if (archive_entry_pathname_l(entry, &path, &len, get_sconv(a)) != 0
	    && errno == ENOMEM) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for Pathname");
		return (ARCHIVE_FATAL);
	}
	if (len == 0 || path == NULL || path[0] == '\0') {
		archive_set_error(&a->archive, -1, "Pathname required");
		return (ARCHIVE_FAILED);
	}

	if (!archive_entry_size_is_set(entry) || archive_entry_size(entry) < 0) {
		archive_set_error(&a->archive, -1, "Size required");
		return (ARCHIVE_FAILED);
	}
	return write_header(a, entry);
}